

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O0

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *bboxes;
  vector<int,_std::allocator<int>_> *picked_00;
  size_type sVar4;
  Mat *this_00;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  double dVar8;
  float *outptr_1;
  int i_4;
  Mat *roi_score_blob;
  float *outptr;
  int i_3;
  Mat *roi_blob;
  int picked_count;
  vector<int,_std::allocator<int>_> picked;
  Rect r;
  float pb_h_1;
  float pb_w_1;
  float *pb_2;
  int i_2;
  float *scoreptr;
  Mat pbs_2;
  int q_2;
  float min_boxsize;
  float im_scale;
  vector<float,_std::allocator<float>_> scores;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  float *pb_1;
  int i_1;
  Mat pbs_1;
  int q_1;
  float im_h;
  float im_w;
  float pb_h;
  float pb_w;
  float pb_cy;
  float pb_cx;
  float cy;
  float cx;
  float dh;
  float dw;
  float dy;
  float dx;
  float *pb;
  int j;
  float anchor_x;
  int i;
  float anchor_h;
  float anchor_w;
  float anchor_y;
  float *anchor;
  Mat pbs;
  float *bbox_hptr;
  float *bbox_wptr;
  float *bbox_yptr;
  float *bbox_xptr;
  int q;
  Mat proposals;
  int num_anchors;
  int h;
  int w;
  Mat *im_info_blob;
  Mat *bbox_blob;
  Mat *score_blob;
  undefined4 in_stack_fffffffffffffa70;
  int in_stack_fffffffffffffa74;
  int _c;
  Mat *in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa80;
  int in_stack_fffffffffffffa84;
  int iVar9;
  size_type in_stack_fffffffffffffa88;
  undefined8 uVar10;
  Mat *in_stack_fffffffffffffa90;
  float *in_stack_fffffffffffffb00;
  float fVar11;
  Mat local_490;
  float *local_450;
  int local_444;
  reference local_440;
  Mat local_438;
  Mat *local_3f8;
  int local_3f0;
  undefined4 local_3ec;
  reference local_3e8;
  int local_3e0;
  int local_3dc;
  vector<int,_std::allocator<int>_> local_3d8;
  float local_3c0;
  float local_3bc;
  float local_3b8;
  float local_3b4;
  float local_3b0;
  float local_3ac;
  float *local_3a8;
  int local_39c;
  Mat local_398;
  float *local_358;
  Mat local_350;
  int local_30c;
  float local_308;
  float local_304;
  vector<float,_std::allocator<float>_> local_300;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> local_2e8;
  float local_2d0;
  float local_2cc;
  float local_2c8;
  float local_2c4;
  float local_2c0;
  float local_2bc;
  float local_2b8;
  float local_2b4;
  float *local_2b0;
  int local_2a4;
  Mat local_2a0;
  int local_25c;
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  float *local_228;
  int local_220;
  float local_21c;
  int local_218;
  float local_214;
  float local_210;
  float local_20c;
  float *local_208;
  Mat local_200;
  Mat local_1c0;
  float *local_180;
  Mat local_178;
  float *local_138;
  Mat local_130;
  float *local_f0;
  Mat local_e8;
  float *local_a8;
  int local_a0;
  Mat local_90;
  int local_4c;
  int local_48;
  int local_44;
  const_reference local_40;
  const_reference local_38;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_38 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_40 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,2);
  local_44 = local_30->w;
  local_48 = local_30->h;
  local_4c = *(int *)(in_RDI + 0x148);
  Mat::Mat(&local_90);
  Mat::create(in_stack_fffffffffffffa90,(int)(in_stack_fffffffffffffa88 >> 0x20),
              (int)in_stack_fffffffffffffa88,in_stack_fffffffffffffa84,
              (size_t)in_stack_fffffffffffffa78,
              (Allocator *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
  for (local_a0 = 0; local_a0 < local_4c; local_a0 = local_a0 + 1) {
    Mat::channel(in_stack_fffffffffffffa78,in_stack_fffffffffffffa74);
    pfVar3 = Mat::operator_cast_to_float_(&local_e8);
    Mat::~Mat((Mat *)0x14cb1b);
    local_a8 = pfVar3;
    Mat::channel(in_stack_fffffffffffffa78,in_stack_fffffffffffffa74);
    pfVar3 = Mat::operator_cast_to_float_(&local_130);
    Mat::~Mat((Mat *)0x14cb76);
    local_f0 = pfVar3;
    Mat::channel(in_stack_fffffffffffffa78,in_stack_fffffffffffffa74);
    pfVar3 = Mat::operator_cast_to_float_(&local_178);
    Mat::~Mat((Mat *)0x14cbd1);
    local_138 = pfVar3;
    Mat::channel(in_stack_fffffffffffffa78,in_stack_fffffffffffffa74);
    pfVar3 = Mat::operator_cast_to_float_(&local_1c0);
    Mat::~Mat((Mat *)0x14cc2c);
    local_180 = pfVar3;
    Mat::channel(in_stack_fffffffffffffa78,in_stack_fffffffffffffa74);
    local_208 = Mat::row((Mat *)(in_RDI + 0x118),local_a0);
    local_20c = local_208[1];
    local_210 = local_208[2] - *local_208;
    local_214 = local_208[3] - local_208[1];
    for (local_218 = 0; local_218 < local_48; local_218 = local_218 + 1) {
      local_21c = *local_208;
      for (local_220 = 0; local_220 < local_44; local_220 = local_220 + 1) {
        local_228 = Mat::row(&local_200,local_218 * local_44 + local_220);
        fVar1 = local_210;
        local_22c = local_a8[local_220];
        local_230 = local_f0[local_220];
        local_234 = local_138[local_220];
        local_238 = local_180[local_220];
        local_23c = local_21c + local_210 * 0.5;
        local_240 = local_20c + local_214 * 0.5;
        local_244 = local_23c + local_210 * local_22c;
        local_248 = local_240 + local_214 * local_230;
        dVar8 = std::exp((double)(ulong)(uint)local_234);
        fVar11 = local_214;
        local_24c = fVar1 * SUB84(dVar8,0);
        dVar8 = std::exp((double)(ulong)(uint)local_238);
        local_250 = fVar11 * SUB84(dVar8,0);
        *local_228 = local_244 - local_24c * 0.5;
        local_228[1] = local_248 - local_250 * 0.5;
        local_228[2] = local_244 + local_24c * 0.5;
        local_228[3] = local_248 + local_250 * 0.5;
        local_21c = (float)*(int *)(in_RDI + 0x80) + local_21c;
      }
      local_a8 = local_a8 + local_44;
      local_f0 = local_f0 + local_44;
      local_138 = local_138 + local_44;
      local_180 = local_180 + local_44;
      local_20c = (float)*(int *)(in_RDI + 0x80) + local_20c;
    }
    Mat::~Mat((Mat *)0x14d1b3);
  }
  bboxes = (vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)Mat::operator[](local_40,1);
  local_254 = *(float *)&(bboxes->super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>).
                         _M_impl.super__Vector_impl_data._M_start;
  picked_00 = (vector<int,_std::allocator<int>_> *)Mat::operator[](local_40,0);
  local_258 = *(float *)&(picked_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
  for (local_25c = 0; local_25c < local_4c; local_25c = local_25c + 1) {
    Mat::channel(in_stack_fffffffffffffa78,in_stack_fffffffffffffa74);
    for (local_2a4 = 0; local_2a4 < local_44 * local_48; local_2a4 = local_2a4 + 1) {
      in_stack_fffffffffffffb00 = Mat::row(&local_2a0,local_2a4);
      local_2b4 = local_254 + -1.0;
      local_2b0 = in_stack_fffffffffffffb00;
      pfVar3 = std::min<float>(in_stack_fffffffffffffb00,&local_2b4);
      local_2b8 = 0.0;
      pfVar3 = std::max<float>(pfVar3,&local_2b8);
      *local_2b0 = *pfVar3;
      local_2bc = local_258 + -1.0;
      pfVar3 = std::min<float>(local_2b0 + 1,&local_2bc);
      local_2c0 = 0.0;
      pfVar3 = std::max<float>(pfVar3,&local_2c0);
      local_2b0[1] = *pfVar3;
      local_2c4 = local_254 + -1.0;
      pfVar3 = std::min<float>(local_2b0 + 2,&local_2c4);
      local_2c8 = 0.0;
      pfVar3 = std::max<float>(pfVar3,&local_2c8);
      local_2b0[2] = *pfVar3;
      local_2cc = local_258 + -1.0;
      pfVar3 = std::min<float>(local_2b0 + 3,&local_2cc);
      local_2d0 = 0.0;
      pfVar3 = std::max<float>(pfVar3,&local_2d0);
      local_2b0[3] = *pfVar3;
    }
    Mat::~Mat((Mat *)0x14d4f2);
  }
  std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::vector
            ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)0x14d515);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x14d522);
  pfVar3 = Mat::operator[](local_40,2);
  local_304 = *pfVar3;
  local_308 = (float)*(int *)(in_RDI + 0x94) * local_304;
  for (local_30c = 0; fVar11 = (float)((ulong)in_stack_fffffffffffffb00 >> 0x20),
      local_30c < local_4c; local_30c = local_30c + 1) {
    Mat::channel(in_stack_fffffffffffffa78,in_stack_fffffffffffffa74);
    Mat::channel(in_stack_fffffffffffffa78,in_stack_fffffffffffffa74);
    pfVar3 = Mat::operator_cast_to_float_(&local_398);
    Mat::~Mat((Mat *)0x14d5f4);
    local_358 = pfVar3;
    for (local_39c = 0; local_39c < local_44 * local_48; local_39c = local_39c + 1) {
      local_3a8 = Mat::row(&local_350,local_39c);
      local_3ac = (local_3a8[2] - *local_3a8) + 1.0;
      local_3b0 = (local_3a8[3] - local_3a8[1]) + 1.0;
      if ((local_308 <= local_3ac) && (local_308 <= local_3b0)) {
        local_3c0 = *local_3a8;
        local_3bc = local_3a8[1];
        local_3b8 = local_3a8[2];
        local_3b4 = local_3a8[3];
        std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::push_back
                  ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)
                   CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                   (value_type *)in_stack_fffffffffffffa78);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                   (value_type_conflict2 *)in_stack_fffffffffffffa78);
      }
    }
    Mat::~Mat((Mat *)0x14d7e7);
  }
  qsort_descent_inplace<ncnn::Rect>
            ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)
             CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
             (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffa78);
  if ((0 < *(int *)(in_RDI + 0x88)) &&
     (iVar9 = *(int *)(in_RDI + 0x88),
     sVar4 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::size(&local_2e8),
     iVar9 < (int)sVar4)) {
    std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize
              ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)in_stack_fffffffffffffa90,
               in_stack_fffffffffffffa88);
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffa90,
               in_stack_fffffffffffffa88);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x14d8b1);
  nms_sorted_bboxes(bboxes,picked_00,fVar11);
  sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_3d8);
  local_3e0 = (int)sVar4;
  this_00 = (Mat *)std::min<int>(&local_3e0,(int *)(in_RDI + 0x8c));
  local_3dc = *(int *)&this_00->data;
  uVar10 = 0;
  local_3e8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  Mat::create(this_00,(int)((ulong)uVar10 >> 0x20),(int)uVar10,in_stack_fffffffffffffa84,
              (size_t)in_stack_fffffffffffffa78,
              (Allocator *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
  bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
  iVar9 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffa84);
  if (bVar2) {
    local_4 = -100;
  }
  else {
    for (local_3f0 = 0; local_3f0 < local_3dc; local_3f0 = local_3f0 + 1) {
      Mat::channel(in_stack_fffffffffffffa78,in_stack_fffffffffffffa74);
      in_stack_fffffffffffffa78 = (Mat *)Mat::operator_cast_to_float_(&local_438);
      Mat::~Mat((Mat *)0x14da12);
      local_3f8 = in_stack_fffffffffffffa78;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_3d8,(long)local_3f0);
      pvVar6 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[]
                         (&local_2e8,(long)*pvVar5);
      *(float *)&local_3f8->data = pvVar6->x1;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_3d8,(long)local_3f0);
      pvVar6 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[]
                         (&local_2e8,(long)*pvVar5);
      *(float *)((long)&local_3f8->data + 4) = pvVar6->y1;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_3d8,(long)local_3f0);
      pvVar6 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[]
                         (&local_2e8,(long)*pvVar5);
      *(float *)&local_3f8->refcount = pvVar6->x2;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_3d8,(long)local_3f0);
      pvVar6 = std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::operator[]
                         (&local_2e8,(long)*pvVar5);
      *(float *)((long)&local_3f8->refcount + 4) = pvVar6->y2;
    }
    sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_20);
    if (1 < sVar4) {
      local_440 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,1);
      Mat::create(this_00,(int)((ulong)uVar10 >> 0x20),(int)uVar10,iVar9,
                  (size_t)in_stack_fffffffffffffa78,
                  (Allocator *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
      bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
      _c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffa74);
      if (bVar2) {
        local_4 = -100;
        goto LAB_0014dcb5;
      }
      for (local_444 = 0; local_444 < local_3dc; local_444 = local_444 + 1) {
        Mat::channel(in_stack_fffffffffffffa78,_c);
        pfVar3 = Mat::operator_cast_to_float_(&local_490);
        Mat::~Mat((Mat *)0x14dc23);
        local_450 = pfVar3;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_3d8,(long)local_444);
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](&local_300,(long)*pvVar5);
        *local_450 = *pvVar7;
      }
    }
    local_4 = 0;
  }
LAB_0014dcb5:
  local_3ec = 1;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar9,in_stack_fffffffffffffa80));
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)CONCAT44(iVar9,in_stack_fffffffffffffa80));
  std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::~vector
            ((vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *)
             CONCAT44(iVar9,in_stack_fffffffffffffa80));
  Mat::~Mat((Mat *)0x14dce9);
  return local_4;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i*w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = anchor_w * exp(dw);
                float pb_h = anchor_h * exp(dh);

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = { pb[0], pb[1], pb[2], pb[3] };
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<int> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i=0; i<picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[ picked[i] ].x1;
        outptr[1] = proposal_boxes[ picked[i] ].y1;
        outptr[2] = proposal_boxes[ picked[i] ].x2;
        outptr[3] = proposal_boxes[ picked[i] ].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i=0; i<picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[ picked[i] ];
        }
    }

    return 0;
}